

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_completions.cc
# Opt level: O0

void gflags::anon_unknown_2::CanonicalizeCursorWordAndSearchOptions
               (string *cursor_word,string *canonical_search_token,CompletionOptions *options)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  int local_68;
  int local_64;
  int found_plusses;
  int found_question_marks;
  string local_40 [32];
  CompletionOptions *local_20;
  CompletionOptions *options_local;
  string *canonical_search_token_local;
  string *cursor_word_local;
  
  local_20 = options;
  options_local = (CompletionOptions *)canonical_search_token;
  canonical_search_token_local = cursor_word;
  std::__cxx11::string::operator=((string *)canonical_search_token,(string *)cursor_word);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)options_local);
    if (*pcVar3 == '\"') {
      std::__cxx11::string::substr((ulong)local_40,(ulong)options_local);
      std::__cxx11::string::operator=((string *)options_local,local_40);
      std::__cxx11::string::~string(local_40);
    }
    while (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)options_local), *pcVar3 == '-')
    {
      std::__cxx11::string::substr((ulong)&found_plusses,(ulong)options_local);
      std::__cxx11::string::operator=((string *)options_local,(string *)&found_plusses);
      std::__cxx11::string::~string((string *)&found_plusses);
    }
    local_20->flag_name_substring_search = false;
    local_20->flag_location_substring_search = false;
    local_20->flag_description_substring_search = false;
    local_20->return_all_matching_flags = false;
    local_20->force_no_update = false;
    local_64 = 0;
    local_68 = 0;
    while( true ) {
      while ((local_64 < 3 && (bVar1 = RemoveTrailingChar((string *)options_local,'?'), bVar1))) {
        local_64 = local_64 + 1;
      }
      if ((0 < local_68) || (bVar1 = RemoveTrailingChar((string *)options_local,'+'), !bVar1))
      break;
      local_68 = local_68 + 1;
    }
    if (2 < local_64) {
      local_20->flag_description_substring_search = true;
    }
    if (1 < local_64) {
      local_20->flag_location_substring_search = true;
    }
    if (0 < local_64) {
      local_20->flag_name_substring_search = true;
    }
    local_20->return_all_matching_flags = 0 < local_68;
  }
  return;
}

Assistant:

static void CanonicalizeCursorWordAndSearchOptions(
    const string &cursor_word,
    string *canonical_search_token,
    CompletionOptions *options) {
  *canonical_search_token = cursor_word;
  if (canonical_search_token->empty()) return;

  // Get rid of leading quotes and dashes in the search term
  if ((*canonical_search_token)[0] == '"')
    *canonical_search_token = canonical_search_token->substr(1);
  while ((*canonical_search_token)[0] == '-')
    *canonical_search_token = canonical_search_token->substr(1);

  options->flag_name_substring_search = false;
  options->flag_location_substring_search = false;
  options->flag_description_substring_search = false;
  options->return_all_matching_flags = false;
  options->force_no_update = false;

  // Look for all search options we can deduce now.  Do this by walking
  // backwards through the term, looking for up to three '?' and up to
  // one '+' as suffixed characters.  Consume them if found, and remove
  // them from the canonical search token.
  int found_question_marks = 0;
  int found_plusses = 0;
  while (true) {
    if (found_question_marks < 3 &&
        RemoveTrailingChar(canonical_search_token, '?')) {
      ++found_question_marks;
      continue;
    }
    if (found_plusses < 1 &&
        RemoveTrailingChar(canonical_search_token, '+')) {
      ++found_plusses;
      continue;
    }
    break;
  }
  
  if (found_question_marks > 2) options->flag_description_substring_search = true;
  if (found_question_marks > 1) options->flag_location_substring_search = true;
  if (found_question_marks > 0) options->flag_name_substring_search = true;

  options->return_all_matching_flags = (found_plusses > 0);
}